

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O2

bool __thiscall QToolBarLayout::movable(QToolBarLayout *this)

{
  bool bVar1;
  QWidget *object;
  QToolBar *this_00;
  QMainWindow *pQVar2;
  
  object = QLayout::parentWidget(&this->super_QLayout);
  this_00 = QtPrivate::qobject_cast_helper<QToolBar*,QObject>(&object->super_QObject);
  if (this_00 == (QToolBar *)0x0) {
    bVar1 = false;
  }
  else {
    pQVar2 = QtPrivate::qobject_cast_helper<QMainWindow*,QObject>
                       (*(QObject **)(*(long *)&(this_00->super_QWidget).field_0x8 + 0x10));
    bVar1 = QToolBar::isMovable(this_00);
    bVar1 = pQVar2 != (QMainWindow *)0x0 && bVar1;
  }
  return bVar1;
}

Assistant:

bool QToolBarLayout::movable() const
{
    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return false;
    QMainWindow *win = qobject_cast<QMainWindow*>(tb->parentWidget());
    return tb->isMovable() && win != nullptr;
}